

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::setExpanded(QTreeWidgetItem *this,bool expand)

{
  byte bVar1;
  QTreeModel *m;
  QTreeWidgetPrivate *__s;
  byte in_SIL;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QTreeModel *model;
  SkipSorting skipSorting;
  QTreeWidget *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 local_30 [24];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  m = treeModel((QTreeWidgetItem *)(CONCAT17(in_SIL,in_stack_ffffffffffffffc0) & 0x1ffffffffffffff),
                in_stack_ffffffffffffffb8);
  if (m != (QTreeModel *)0x0) {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTreeModel::SkipSorting::SkipSorting((SkipSorting *)local_18,m);
    __s = QTreeWidget::d_func((QTreeWidget *)0x912833);
    QTreeWidgetPrivate::index((QTreeWidgetPrivate *)local_30,(char *)__s,(int)in_RDI);
    QTreeView::setExpanded
              ((QTreeView *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),(QModelIndex *)m,
               SUB81((ulong)in_RDI >> 0x38,0));
    QTreeModel::SkipSorting::~SkipSorting((SkipSorting *)local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::setExpanded(bool expand)
{
    const QTreeModel *model = treeModel();
    if (!model)
        return;
    QTreeModel::SkipSorting skipSorting(model);
    view->setExpanded(view->d_func()->index(this), expand);
}